

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

void __thiscall FNodeBuilder::RemoveSegFromVert2(FNodeBuilder *this,DWORD segnum,int vertnum)

{
  FPrivVert *pFVar1;
  FPrivSeg *pFVar2;
  uint uVar3;
  ulong uVar4;
  
  pFVar1 = (this->Vertices).Array;
  uVar3 = pFVar1[vertnum].segs2;
  if (uVar3 == segnum) {
    pFVar1[vertnum].segs2 = (this->Segs).Array[segnum].nextforvert2;
    return;
  }
  pFVar2 = (this->Segs).Array;
  uVar4 = 0;
  for (; (uVar3 != 0xffffffff && (uVar3 != segnum)); uVar3 = pFVar2[uVar3].nextforvert2) {
    uVar4 = (ulong)uVar3;
  }
  if (uVar3 == segnum) {
    pFVar2[uVar4].nextforvert2 = pFVar2[segnum].nextforvert2;
  }
  return;
}

Assistant:

void FNodeBuilder::RemoveSegFromVert2 (DWORD segnum, int vertnum)
{
	FPrivVert *v = &Vertices[vertnum];

	if (v->segs2 == segnum)
	{
		v->segs2 = Segs[segnum].nextforvert2;
	}
	else
	{
		DWORD prev, curr;
		prev = 0;
		curr = v->segs2;
		while (curr != DWORD_MAX && curr != segnum)
		{
			prev = curr;
			curr = Segs[curr].nextforvert2;
		}
		if (curr == segnum)
		{
			Segs[prev].nextforvert2 = Segs[curr].nextforvert2;
		}
	}
}